

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

int Storage::Tape::MSX::Parser::get_byte(FileSpeed *speed,BinaryTapePlayer *tape_player)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  IntType IVar5;
  IntType IVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int transitions;
  float local_58;
  uint local_54;
  undefined8 *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  uint local_3c;
  
  bVar1 = BinaryTapePlayer::get_motor_control(tape_player);
  if (bVar1) {
    bVar7 = speed->minimum_start_bit_duration;
    bVar8 = 0;
    do {
      TapePlayer::get_tape(&tape_player->super_TapePlayer);
      cVar2 = (**(code **)*local_50)();
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if (cVar2 != '\0') break;
      bVar1 = BinaryTapePlayer::get_input(tape_player);
      bVar3 = BinaryTapePlayer::get_input(tape_player);
      local_58 = 0.0;
      if (bVar1 == bVar3) {
        local_58 = 0.0;
        do {
          IVar5 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
          IVar6 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
          local_58 = local_58 + (float)IVar5 / (float)IVar6;
          TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
          bVar3 = BinaryTapePlayer::get_input(tape_player);
        } while (bVar1 == bVar3);
      }
      bVar8 = ((float)bVar7 * 1.145e-05 * 0.5 <= local_58) + bVar8 * '\x02';
    } while ((~bVar8 & 3) != 0);
    bVar8 = speed->low_high_disrimination_duration;
    IVar5 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
    bVar1 = BinaryTapePlayer::get_input(tape_player);
    iVar10 = 8;
    local_54 = 0;
    do {
      TapePlayer::get_tape(&tape_player->super_TapePlayer);
      cVar2 = (**(code **)*local_50)();
      if (cVar2 != '\0') {
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          return local_54;
        }
        return local_54;
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      bVar3 = iVar10 == 0;
      iVar10 = iVar10 + -1;
      if (bVar3) {
        return local_54;
      }
      local_3c = 0;
      iVar9 = (int)((float)IVar5 * (float)bVar8 * 1.73e-05 + 0.5);
      while( true ) {
        TapePlayer::get_tape(&tape_player->super_TapePlayer);
        cVar2 = (**(code **)*local_50)();
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        }
        if (cVar2 != '\0' || iVar9 == 0) break;
        IVar6 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        iVar4 = (int)IVar6;
        if (iVar9 < (int)IVar6) {
          iVar4 = iVar9;
        }
        iVar9 = iVar9 - iVar4;
        BinaryTapePlayer::run_for(tape_player,(Cycles)(long)iVar4);
        bVar3 = BinaryTapePlayer::get_input(tape_player);
        if (bVar3 != bVar1) {
          bVar1 = BinaryTapePlayer::get_input(tape_player);
          local_3c = local_3c + 1;
        }
      }
      TapePlayer::get_tape(&tape_player->super_TapePlayer);
      cVar2 = (**(code **)*local_50)();
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if (cVar2 != '\0' || 3 < local_3c) {
        return -1;
      }
      local_54 = local_54 >> 1 | *(uint *)(&DAT_004e2344 + (ulong)local_3c * 4);
      bVar7 = (byte)local_3c & 1;
      do {
        do {
          TapePlayer::get_tape(&tape_player->super_TapePlayer);
          cVar2 = (**(code **)*local_50)();
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          if (cVar2 != '\0') goto LAB_0045056f;
          TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
          bVar3 = BinaryTapePlayer::get_input(tape_player);
        } while (bVar3 == bVar1);
        bVar1 = BinaryTapePlayer::get_input(tape_player);
        bVar3 = bVar7 == 0;
        bVar7 = 1;
      } while (bVar3);
LAB_0045056f:
      TapePlayer::get_tape(&tape_player->super_TapePlayer);
      cVar2 = (**(code **)*local_50)();
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
    } while (cVar2 == '\0');
  }
  return -1;
}

Assistant:

int Parser::get_byte(const FileSpeed &speed, Storage::Tape::BinaryTapePlayer &tape_player) {
	if(!tape_player.get_motor_control()) {
		return -1;
	}

	/*
		"The cassette is first read continuously until a start bit is found.
		This is done by locating a negative transition, measuring the following
		cycle length (1B1FH) and comparing this to see if it is greater than LOWLIM."

		... but I don't buy that, as it makes the process overly dependent on phase.
		So I'm going to look for the next two consecutive pulses that are each big
		enough to be half of a zero.
	*/
	const float minimum_start_bit_duration = float(speed.minimum_start_bit_duration) * 0.00001145f * 0.5f;
	int input = 0;
	while(!tape_player.get_tape()->is_at_end()) {
		// Find next transition.
		bool level = tape_player.get_input();
		float duration = 0.0;
		while(level == tape_player.get_input()) {
			duration += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
			tape_player.run_for_input_pulse();
		}

		input = (input << 1);
		if(duration >= minimum_start_bit_duration) input |= 1;
		if((input&3) == 3) break;
	}

	/*
		"Each of the eight data bits is then read by counting the number of transitions within
		a fixed period of time (1B03H). If zero or one transitions are found it is a 0 bit, if two
		or three are found it is a 1 bit. If more than three transitions are found the routine
		terminates with Flag C as this is presumed to be a hardware error of some sort."
	*/
	int result = 0;
	const int cycles_per_window = int(
		0.5f +
		float(speed.low_high_disrimination_duration) *
		0.0000173f *
		float(tape_player.get_input_clock_rate())
	);
	int bits_left = 8;
	bool level = tape_player.get_input();
	while(!tape_player.get_tape()->is_at_end() && bits_left--) {
		// Count number of transitions within cycles_per_window.
		int transitions = 0;
		int cycles_remaining = cycles_per_window;
		while(!tape_player.get_tape()->is_at_end() && cycles_remaining) {
			const int cycles_until_next_event = int(tape_player.get_cycles_until_next_event());
			const int cycles_to_run_for = std::min(cycles_until_next_event, cycles_remaining);

			cycles_remaining -= cycles_to_run_for;
			tape_player.run_for(Cycles(cycles_to_run_for));

			if(level != tape_player.get_input()) {
				level = tape_player.get_input();
				transitions++;
			}
		}

		if(tape_player.get_tape()->is_at_end()) return -1;

		int next_bit = 0;
		switch(transitions) {
			case 0: case 1:
				next_bit = 0x00;
			break;
			case 2: case 3:
				next_bit = 0x80;
			break;
			default:
			return -1;
		}
		result = (result >> 1) | next_bit;

		/*
			"After the value of each bit has been determined a further one or two transitions are read (1B23H)
			to retain synchronization. With an odd transition count one more will be read, with an even
			transition count two more."
		*/
		int required_transitions = 2 - (transitions&1);
		while(!tape_player.get_tape()->is_at_end()) {
			tape_player.run_for_input_pulse();
			if(level != tape_player.get_input()) {
				level = tape_player.get_input();
				required_transitions--;
				if(!required_transitions) break;
			}
		}

		if(tape_player.get_tape()->is_at_end()) return -1;
	}
	return result;
}